

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring_stage9.h
# Opt level: O2

string * __thiscall pstring::str_abi_cxx11_(string *__return_storage_ptr__,pstring *this)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = this->m_buffer_;
  sVar2 = this->m_length_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
        // For sanity checks only.
    {
        return { m_buffer_, m_length_ };
    }